

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cd_hull.cpp
# Opt level: O3

void __thiscall
ConvexDecomposition::Array<ConvexDecomposition::ConvexH::HalfEdge>::allocate
          (Array<ConvexDecomposition::ConvexH::HalfEdge> *this,int s)

{
  int iVar1;
  HalfEdge *__ptr;
  HalfEdge *pHVar2;
  long lVar3;
  
  if (s < 1) {
    __assert_fail("s>0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                  ,0x5bf,
                  "void ConvexDecomposition::Array<ConvexDecomposition::ConvexH::HalfEdge>::allocate(int) [Type = ConvexDecomposition::ConvexH::HalfEdge]"
                 );
  }
  iVar1 = this->count;
  if (s < iVar1) {
    __assert_fail("s>=count",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                  ,0x5c0,
                  "void ConvexDecomposition::Array<ConvexDecomposition::ConvexH::HalfEdge>::allocate(int) [Type = ConvexDecomposition::ConvexH::HalfEdge]"
                 );
  }
  __ptr = this->element;
  this->array_size = s;
  pHVar2 = (HalfEdge *)malloc((ulong)(uint)s << 2);
  this->element = pHVar2;
  if (pHVar2 == (HalfEdge *)0x0) {
    __assert_fail("element",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                  ,0x5c4,
                  "void ConvexDecomposition::Array<ConvexDecomposition::ConvexH::HalfEdge>::allocate(int) [Type = ConvexDecomposition::ConvexH::HalfEdge]"
                 );
  }
  if (iVar1 < 1) {
    if (__ptr == (HalfEdge *)0x0) {
      return;
    }
  }
  else {
    lVar3 = 0;
    do {
      this->element[lVar3] = __ptr[lVar3];
      lVar3 = lVar3 + 1;
    } while (lVar3 < this->count);
  }
  free(__ptr);
  return;
}

Assistant:

void Array<Type>::allocate(int s)
{
	assert(s>0);
	assert(s>=count);
	Type *old = element;
	array_size =s;
	element = (Type *) malloc( sizeof(Type)*array_size);
	assert(element);
	for(int i=0;i<count;i++)
	{
		element[i]=old[i];
	}
	if(old)
	{
		free(old);
	}
}